

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commander.c
# Opt level: O1

void command_help(command_t *self)

{
  long lVar1;
  char **ppcVar2;
  
  putchar(10);
  printf("  Usage: %s %s\n",self->name,self->usage);
  putchar(10);
  puts("  Options:");
  putchar(10);
  if (0 < self->option_count) {
    ppcVar2 = &self->options[0].description;
    lVar1 = 0;
    do {
      printf("    %s, %-25s %s\n",ppcVar2[-2],ppcVar2[-1],*ppcVar2);
      lVar1 = lVar1 + 1;
      ppcVar2 = ppcVar2 + 7;
    } while (lVar1 < self->option_count);
  }
  putchar(10);
  exit(0);
}

Assistant:

void
command_help(command_t *self) {
  printf("\n");
  printf("  Usage: %s %s\n", self->name, self->usage);
  printf("\n");
  printf("  Options:\n");
  printf("\n");
  int i;
  for (i = 0; i < self->option_count; ++i) {
    command_option_t *option = &self->options[i];
    printf("    %s, %-25s %s\n"
      , option->small
      , option->large_with_arg
      , option->description);
  }
  printf("\n");
  exit(0);
}